

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O1

void __thiscall SceneRender::renderNormalBuffer(SceneRender *this,Uniforms *_uniforms)

{
  _Rb_tree_header *p_Var1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Camera *_camera;
  Shader *pSVar26;
  long lVar27;
  mapped_type *ppSVar28;
  float *pfVar29;
  _Base_ptr p_Var30;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  mat4 local_1a8;
  undefined8 local_168;
  undefined8 uStack_160;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  size_type local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  undefined8 uStack_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  size_type local_b8;
  undefined8 uStack_b0;
  string local_a0;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  string local_60;
  Tracker *local_40;
  Fbo *local_38;
  
  if ((this->normalFbo).m_allocated == true) {
    local_38 = &this->normalFbo;
    vera::Fbo::bind(local_38,(int)_uniforms,in_RDX,in_ECX);
    if (this->m_depth_test == true) {
      glEnable(0xb71);
    }
    _camera = (_uniforms->super_Scene).activeCamera;
    if (((_camera->super_Node).bChange != false) || ((this->m_origin).bChange == true)) {
      vera::setCamera(_camera);
      vera::applyMatrix(&(this->m_origin).m_transformMatrix);
    }
    if (-1 < this->m_floor_subd_target) {
      local_1a8.value[0]._0_8_ = local_1a8.value + 1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"normal","");
      ppSVar28 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                 ::operator[](&(this->m_floor).gBuffersShaders,(key_type *)&local_1a8);
      pSVar26 = *ppSVar28;
      if ((col_type *)local_1a8.value[0]._0_8_ != local_1a8.value + 1) {
        operator_delete((void *)local_1a8.value[0]._0_8_,
                        CONCAT44(local_1a8.value[1].field_1,local_1a8.value[1].field_0) + 1);
      }
      if (pSVar26 != (Shader *)0x0) {
        if ((_uniforms->tracker).m_running == true) {
          local_1a8.value[0]._0_8_ = local_1a8.value + 1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1a8,"render:sceneNormal:floor","");
          Tracker::begin(&_uniforms->tracker,(string *)&local_1a8);
          if ((col_type *)local_1a8.value[0]._0_8_ != local_1a8.value + 1) {
            operator_delete((void *)local_1a8.value[0]._0_8_,
                            CONCAT44(local_1a8.value[1].field_1,local_1a8.value[1].field_0) + 1);
          }
        }
        vera::Shader::use(pSVar26);
        (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar26,0);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"u_modelViewProjectionMatrix","");
        vera::getProjectionViewWorldMatrix();
        fVar31 = SUB84(local_a0._M_dataplus._M_p,0);
        local_c8 = (float)((ulong)local_a0._M_dataplus._M_p >> 0x20);
        local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_a0._M_dataplus._M_p;
        uStack_d0 = 0;
        fVar33 = (float)local_a0._M_string_length;
        local_108 = (float)(local_a0._M_string_length >> 0x20);
        fVar34 = (float)local_a0.field_2._M_allocated_capacity;
        local_118 = (float)((ulong)local_a0.field_2._0_8_ >> 0x20);
        local_128 = local_a0.field_2._M_allocated_capacity;
        uStack_120 = 0;
        fVar35 = (float)local_a0.field_2._8_8_;
        local_e8 = (float)((ulong)local_a0.field_2._8_8_ >> 0x20);
        fVar36 = (float)local_80;
        local_f8 = (float)((ulong)local_80 >> 0x20);
        fVar2 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_0.x;
        fVar3 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_1.y;
        fVar4 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_2.z;
        local_b8 = local_a0._M_string_length;
        uStack_b0 = 0;
        local_138 = local_a0.field_2._8_8_;
        uStack_130 = 0;
        local_148 = local_80;
        uStack_140 = 0;
        fVar32 = (float)local_78;
        local_158 = (float)((ulong)local_78 >> 0x20);
        local_168 = local_78;
        uStack_160 = 0;
        fVar37 = (float)local_70;
        fVar38 = (float)((ulong)local_70 >> 0x20);
        fVar5 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_3.w;
        fVar39 = (float)local_68;
        local_1a8.value[0].field_2.z =
             fVar39 * fVar5 + fVar32 * fVar4 + fVar35 * fVar3 + fVar33 * fVar2;
        fVar40 = (float)((ulong)local_68 >> 0x20);
        local_1a8.value[0].field_3.w =
             fVar5 * fVar40 + fVar4 * local_158 + fVar3 * local_e8 + fVar2 * local_108;
        fVar6 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_0.x;
        fVar7 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_1.y;
        fVar8 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_2.z;
        fVar9 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_3.w;
        fVar10 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_0.x;
        fVar11 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_1.y;
        fVar12 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_2.z;
        fVar13 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_3.w;
        fVar14 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_0.x;
        fVar15 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_1.y;
        fVar16 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_2.z;
        fVar17 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_3.w;
        local_1a8.value[0].field_1.y =
             fVar38 * fVar5 + local_f8 * fVar4 + local_118 * fVar3 + local_c8 * fVar2;
        local_1a8.value[0].field_0.x =
             fVar37 * fVar5 + fVar36 * fVar4 + fVar34 * fVar3 + fVar31 * fVar2;
        local_1a8.value[1].field_0.x =
             fVar37 * fVar9 + fVar36 * fVar8 + fVar34 * fVar7 + fVar31 * fVar6;
        local_1a8.value[1].field_1.y =
             fVar38 * fVar9 + local_f8 * fVar8 + local_118 * fVar7 + local_c8 * fVar6;
        local_1a8.value[1].field_2.z =
             fVar39 * fVar9 + fVar32 * fVar8 + fVar35 * fVar7 + fVar33 * fVar6;
        local_1a8.value[1].field_3.w =
             fVar9 * fVar40 + fVar8 * local_158 + fVar7 * local_e8 + fVar6 * local_108;
        local_1a8.value[2].field_0.x =
             fVar37 * fVar13 + fVar36 * fVar12 + fVar34 * fVar11 + fVar31 * fVar10;
        local_1a8.value[2].field_1.y =
             fVar38 * fVar13 + local_f8 * fVar12 + local_118 * fVar11 + local_c8 * fVar10;
        local_1a8.value[2].field_2.z =
             fVar39 * fVar13 + fVar32 * fVar12 + fVar35 * fVar11 + fVar33 * fVar10;
        local_1a8.value[2].field_3.w =
             fVar13 * fVar40 + fVar12 * local_158 + fVar11 * local_e8 + fVar10 * local_108;
        local_1a8.value[3].field_0.x =
             fVar37 * fVar17 + fVar36 * fVar16 + fVar34 * fVar15 + fVar31 * fVar14;
        local_1a8.value[3].field_1.y =
             fVar38 * fVar17 + local_f8 * fVar16 + local_118 * fVar15 + local_c8 * fVar14;
        local_1a8.value[3].field_2.z =
             fVar39 * fVar17 + fVar32 * fVar16 + fVar35 * fVar15 + fVar33 * fVar14;
        local_1a8.value[3].field_3.w =
             fVar40 * fVar17 + local_158 * fVar16 + local_e8 * fVar15 + local_108 * fVar14;
        fStack_154 = local_158;
        fStack_150 = local_158;
        fStack_14c = local_158;
        fStack_114 = local_118;
        fStack_110 = local_118;
        fStack_10c = local_118;
        fStack_104 = local_108;
        fStack_100 = local_108;
        fStack_fc = local_108;
        fStack_f4 = local_f8;
        fStack_f0 = local_f8;
        fStack_ec = local_f8;
        fStack_e4 = local_e8;
        fStack_e0 = local_e8;
        fStack_dc = local_e8;
        fStack_c4 = local_c8;
        fStack_c0 = local_c8;
        fStack_bc = local_c8;
        vera::Shader::setUniform(pSVar26,&local_60,&local_1a8,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        local_1a8.value[0]._0_8_ = local_1a8.value + 1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"u_model","");
        vera::Shader::setUniform
                  (pSVar26,(string *)&local_1a8,
                   (this->m_origin).m_position.field_0.x +
                   (this->m_floor).super_Node.m_position.field_0.x,
                   (this->m_origin).m_position.field_1.y +
                   (this->m_floor).super_Node.m_position.field_1.y,
                   (this->m_origin).m_position.field_2.z +
                   (this->m_floor).super_Node.m_position.field_2.z);
        if ((col_type *)local_1a8.value[0]._0_8_ != local_1a8.value + 1) {
          operator_delete((void *)local_1a8.value[0]._0_8_,
                          CONCAT44(local_1a8.value[1].field_1,local_1a8.value[1].field_0) + 1);
        }
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"u_modelMatrix","");
        local_d8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_0;
        local_d8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_1;
        uStack_d0 = 0;
        local_b8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_2;
        local_b8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_3;
        local_128._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_0;
        local_128._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_1;
        uStack_120 = 0;
        local_138._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_2;
        local_138._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_3;
        local_148._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_0;
        local_148._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_1;
        fVar2 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_0.x;
        fVar3 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_1.y;
        fVar4 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_2.z;
        uStack_b0 = 0;
        uStack_130 = 0;
        uStack_140 = 0;
        local_168._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_2;
        local_168._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_3;
        uStack_160 = 0;
        uVar18 = (this->m_origin).m_transformMatrix.value[3].field_0;
        uVar22 = (this->m_origin).m_transformMatrix.value[3].field_1;
        fVar5 = (this->m_floor).super_Node.m_transformMatrix.value[0].field_3.w;
        uVar19 = (this->m_origin).m_transformMatrix.value[3].field_2;
        uVar23 = (this->m_origin).m_transformMatrix.value[3].field_3;
        local_1a8.value[0].field_2.z =
             (float)uVar19 * fVar5 +
             (float)(undefined4)local_168 * fVar4 +
             (float)(undefined4)local_138 * fVar3 + (float)(undefined4)local_b8 * fVar2;
        local_1a8.value[0].field_3.w =
             fVar5 * (float)uVar23 +
             fVar4 * (float)local_168._4_4_ +
             fVar3 * (float)local_138._4_4_ + fVar2 * (float)local_b8._4_4_;
        fVar6 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_0.x;
        fVar7 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_1.y;
        fVar8 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_2.z;
        fVar9 = (this->m_floor).super_Node.m_transformMatrix.value[1].field_3.w;
        fVar10 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_0.x;
        fVar11 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_1.y;
        fVar12 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_2.z;
        fVar13 = (this->m_floor).super_Node.m_transformMatrix.value[2].field_3.w;
        fVar14 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_0.x;
        fVar15 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_1.y;
        fVar16 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_2.z;
        fVar17 = (this->m_floor).super_Node.m_transformMatrix.value[3].field_3.w;
        local_1a8.value[0].field_1.y =
             (float)uVar22 * fVar5 +
             (float)local_148._4_4_ * fVar4 +
             (float)local_128._4_4_ * fVar3 + (float)local_d8._4_4_ * fVar2;
        local_1a8.value[0].field_0.x =
             (float)uVar18 * fVar5 +
             (float)(undefined4)local_148 * fVar4 +
             (float)(undefined4)local_128 * fVar3 + (float)local_d8._0_4_ * fVar2;
        local_1a8.value[1].field_0.x =
             (float)uVar18 * fVar9 +
             (float)(undefined4)local_148 * fVar8 +
             (float)(undefined4)local_128 * fVar7 + (float)local_d8._0_4_ * fVar6;
        local_1a8.value[1].field_1.y =
             (float)uVar22 * fVar9 +
             (float)local_148._4_4_ * fVar8 +
             (float)local_128._4_4_ * fVar7 + (float)local_d8._4_4_ * fVar6;
        local_1a8.value[1].field_2.z =
             (float)uVar19 * fVar9 +
             (float)(undefined4)local_168 * fVar8 +
             (float)(undefined4)local_138 * fVar7 + (float)(undefined4)local_b8 * fVar6;
        local_1a8.value[1].field_3.w =
             fVar9 * (float)uVar23 +
             fVar8 * (float)local_168._4_4_ +
             fVar7 * (float)local_138._4_4_ + fVar6 * (float)local_b8._4_4_;
        local_1a8.value[2].field_0.x =
             (float)uVar18 * fVar13 +
             (float)(undefined4)local_148 * fVar12 +
             (float)(undefined4)local_128 * fVar11 + (float)local_d8._0_4_ * fVar10;
        local_1a8.value[2].field_1.y =
             (float)uVar22 * fVar13 +
             (float)local_148._4_4_ * fVar12 +
             (float)local_128._4_4_ * fVar11 + (float)local_d8._4_4_ * fVar10;
        local_1a8.value[2].field_2.z =
             (float)uVar19 * fVar13 +
             (float)(undefined4)local_168 * fVar12 +
             (float)(undefined4)local_138 * fVar11 + (float)(undefined4)local_b8 * fVar10;
        local_1a8.value[2].field_3.w =
             fVar13 * (float)uVar23 +
             fVar12 * (float)local_168._4_4_ +
             fVar11 * (float)local_138._4_4_ + fVar10 * (float)local_b8._4_4_;
        local_1a8.value[3].field_0.x =
             (float)uVar18 * fVar17 +
             (float)(undefined4)local_148 * fVar16 +
             (float)(undefined4)local_128 * fVar15 + (float)local_d8._0_4_ * fVar14;
        local_1a8.value[3].field_1.y =
             (float)uVar22 * fVar17 +
             (float)local_148._4_4_ * fVar16 +
             (float)local_128._4_4_ * fVar15 + (float)local_d8._4_4_ * fVar14;
        local_1a8.value[3].field_2.z =
             (float)uVar19 * fVar17 +
             (float)(undefined4)local_168 * fVar16 +
             (float)(undefined4)local_138 * fVar15 + (float)(undefined4)local_b8 * fVar14;
        local_1a8.value[3].field_3.w =
             (float)uVar23 * fVar17 +
             (float)local_168._4_4_ * fVar16 +
             (float)local_138._4_4_ * fVar15 + (float)local_b8._4_4_ * fVar14;
        local_158 = (float)local_168._4_4_;
        fStack_154 = (float)local_168._4_4_;
        fStack_150 = (float)local_168._4_4_;
        fStack_14c = (float)local_168._4_4_;
        local_118 = (float)local_128._4_4_;
        fStack_114 = (float)local_128._4_4_;
        fStack_110 = (float)local_128._4_4_;
        fStack_10c = (float)local_128._4_4_;
        local_108 = (float)local_b8._4_4_;
        fStack_104 = (float)local_b8._4_4_;
        fStack_100 = (float)local_b8._4_4_;
        fStack_fc = (float)local_b8._4_4_;
        local_f8 = (float)local_148._4_4_;
        fStack_f4 = (float)local_148._4_4_;
        fStack_f0 = (float)local_148._4_4_;
        fStack_ec = (float)local_148._4_4_;
        local_e8 = (float)local_138._4_4_;
        fStack_e4 = (float)local_138._4_4_;
        fStack_e0 = (float)local_138._4_4_;
        fStack_dc = (float)local_138._4_4_;
        local_c8 = (float)local_d8._4_4_;
        fStack_c4 = (float)local_d8._4_4_;
        fStack_c0 = (float)local_d8._4_4_;
        fStack_bc = (float)local_d8._4_4_;
        vera::Shader::setUniform(pSVar26,&local_a0,&local_1a8,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        vera::Model::render(&this->m_floor,pSVar26);
        if ((_uniforms->tracker).m_running == true) {
          local_1a8.value[0]._0_8_ = local_1a8.value + 1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1a8,"render:sceneNormal:floor","");
          Tracker::end(&_uniforms->tracker,(string *)&local_1a8);
          if ((col_type *)local_1a8.value[0]._0_8_ != local_1a8.value + 1) {
            operator_delete((void *)local_1a8.value[0]._0_8_,
                            CONCAT44(local_1a8.value[1].field_1,local_1a8.value[1].field_0) + 1);
          }
        }
      }
    }
    vera::cullingMode(this->m_culling);
    p_Var30 = (_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var30 != p_Var1) {
      local_40 = &_uniforms->tracker;
      do {
        lVar27 = *(long *)(p_Var30 + 2);
        local_1a8.value[0]._0_8_ = local_1a8.value + 1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"normal","");
        ppSVar28 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Shader_*>_>_>
                                 *)(lVar27 + 600),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_1a8);
        pSVar26 = *ppSVar28;
        if ((col_type *)local_1a8.value[0]._0_8_ != local_1a8.value + 1) {
          operator_delete((void *)local_1a8.value[0]._0_8_,
                          CONCAT44(local_1a8.value[1].field_1,local_1a8.value[1].field_0) + 1);
        }
        if (pSVar26 != (Shader *)0x0) {
          if ((_uniforms->tracker).m_running == true) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1a8,"render:sceneNormal:",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (*(long *)(p_Var30 + 2) + 0x2b0));
            Tracker::begin(local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_1a8);
            if ((col_type *)local_1a8.value[0]._0_8_ != local_1a8.value + 1) {
              operator_delete((void *)local_1a8.value[0]._0_8_,
                              CONCAT44(local_1a8.value[1].field_1,local_1a8.value[1].field_0) + 1);
            }
          }
          vera::Shader::use(pSVar26);
          (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar26,0);
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_60,"u_modelViewProjectionMatrix","");
          vera::getProjectionViewWorldMatrix();
          pfVar29 = (float *)(**(code **)(**(long **)(p_Var30 + 2) + 0x100))();
          fVar31 = SUB84(local_a0._M_dataplus._M_p,0);
          local_c8 = (float)((ulong)local_a0._M_dataplus._M_p >> 0x20);
          local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_a0._M_dataplus._M_p;
          uStack_d0 = 0;
          fVar33 = (float)local_a0._M_string_length;
          local_108 = (float)(local_a0._M_string_length >> 0x20);
          fVar34 = (float)local_a0.field_2._M_allocated_capacity;
          local_118 = (float)((ulong)local_a0.field_2._0_8_ >> 0x20);
          local_128 = local_a0.field_2._M_allocated_capacity;
          uStack_120 = 0;
          fVar35 = (float)local_a0.field_2._8_8_;
          local_e8 = (float)((ulong)local_a0.field_2._8_8_ >> 0x20);
          fVar36 = (float)local_80;
          local_f8 = (float)((ulong)local_80 >> 0x20);
          fVar2 = *pfVar29;
          fVar3 = pfVar29[1];
          fVar4 = pfVar29[2];
          local_b8 = local_a0._M_string_length;
          uStack_b0 = 0;
          local_138 = local_a0.field_2._8_8_;
          uStack_130 = 0;
          local_148 = local_80;
          uStack_140 = 0;
          fVar32 = (float)local_78;
          local_158 = (float)((ulong)local_78 >> 0x20);
          local_168 = local_78;
          uStack_160 = 0;
          fVar37 = (float)local_70;
          fVar38 = (float)((ulong)local_70 >> 0x20);
          fVar5 = pfVar29[3];
          fVar39 = (float)local_68;
          local_1a8.value[0].field_2.z =
               fVar39 * fVar5 + fVar32 * fVar4 + fVar35 * fVar3 + fVar33 * fVar2;
          fVar40 = (float)((ulong)local_68 >> 0x20);
          local_1a8.value[0].field_3.w =
               fVar5 * fVar40 + fVar4 * local_158 + fVar3 * local_e8 + fVar2 * local_108;
          fVar6 = pfVar29[4];
          fVar7 = pfVar29[5];
          fVar8 = pfVar29[6];
          fVar9 = pfVar29[7];
          fVar10 = pfVar29[8];
          fVar11 = pfVar29[9];
          fVar12 = pfVar29[10];
          fVar13 = pfVar29[0xb];
          fVar14 = pfVar29[0xc];
          fVar15 = pfVar29[0xd];
          fVar16 = pfVar29[0xe];
          fVar17 = pfVar29[0xf];
          local_1a8.value[0].field_1.y =
               fVar38 * fVar5 + local_f8 * fVar4 + local_118 * fVar3 + local_c8 * fVar2;
          local_1a8.value[0].field_0.x =
               fVar37 * fVar5 + fVar36 * fVar4 + fVar34 * fVar3 + fVar31 * fVar2;
          local_1a8.value[1].field_0.x =
               fVar37 * fVar9 + fVar36 * fVar8 + fVar34 * fVar7 + fVar31 * fVar6;
          local_1a8.value[1].field_1.y =
               fVar38 * fVar9 + local_f8 * fVar8 + local_118 * fVar7 + local_c8 * fVar6;
          local_1a8.value[1].field_2.z =
               fVar39 * fVar9 + fVar32 * fVar8 + fVar35 * fVar7 + fVar33 * fVar6;
          local_1a8.value[1].field_3.w =
               fVar9 * fVar40 + fVar8 * local_158 + fVar7 * local_e8 + fVar6 * local_108;
          local_1a8.value[2].field_0.x =
               fVar37 * fVar13 + fVar36 * fVar12 + fVar34 * fVar11 + fVar31 * fVar10;
          local_1a8.value[2].field_1.y =
               fVar38 * fVar13 + local_f8 * fVar12 + local_118 * fVar11 + local_c8 * fVar10;
          local_1a8.value[2].field_2.z =
               fVar39 * fVar13 + fVar32 * fVar12 + fVar35 * fVar11 + fVar33 * fVar10;
          local_1a8.value[2].field_3.w =
               fVar13 * fVar40 + fVar12 * local_158 + fVar11 * local_e8 + fVar10 * local_108;
          local_1a8.value[3].field_0.x =
               fVar37 * fVar17 + fVar36 * fVar16 + fVar34 * fVar15 + fVar31 * fVar14;
          local_1a8.value[3].field_1.y =
               fVar38 * fVar17 + local_f8 * fVar16 + local_118 * fVar15 + local_c8 * fVar14;
          local_1a8.value[3].field_2.z =
               fVar39 * fVar17 + fVar32 * fVar16 + fVar35 * fVar15 + fVar33 * fVar14;
          local_1a8.value[3].field_3.w =
               fVar40 * fVar17 + local_158 * fVar16 + local_e8 * fVar15 + local_108 * fVar14;
          fStack_154 = local_158;
          fStack_150 = local_158;
          fStack_14c = local_158;
          fStack_114 = local_118;
          fStack_110 = local_118;
          fStack_10c = local_118;
          fStack_104 = local_108;
          fStack_100 = local_108;
          fStack_fc = local_108;
          fStack_f4 = local_f8;
          fStack_f0 = local_f8;
          fStack_ec = local_f8;
          fStack_e4 = local_e8;
          fStack_e0 = local_e8;
          fStack_dc = local_e8;
          fStack_c4 = local_c8;
          fStack_c0 = local_c8;
          fStack_bc = local_c8;
          vera::Shader::setUniform(pSVar26,&local_60,&local_1a8,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          local_1a8.value[0]._0_8_ = local_1a8.value + 1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"u_model","");
          pfVar29 = (float *)(**(code **)(**(long **)(p_Var30 + 2) + 0x98))();
          vera::Shader::setUniform
                    (pSVar26,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1a8,(this->m_origin).m_position.field_0.x + *pfVar29,
                     (this->m_origin).m_position.field_1.y + pfVar29[1],
                     (this->m_origin).m_position.field_2.z + pfVar29[2]);
          if ((col_type *)local_1a8.value[0]._0_8_ != local_1a8.value + 1) {
            operator_delete((void *)local_1a8.value[0]._0_8_,
                            CONCAT44(local_1a8.value[1].field_1,local_1a8.value[1].field_0) + 1);
          }
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"u_modelMatrix","");
          pfVar29 = (float *)(**(code **)(**(long **)(p_Var30 + 2) + 0x100))();
          local_d8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_0;
          local_d8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_1;
          uStack_d0 = 0;
          local_b8._0_4_ = (this->m_origin).m_transformMatrix.value[0].field_2;
          local_b8._4_4_ = (this->m_origin).m_transformMatrix.value[0].field_3;
          local_128._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_0;
          local_128._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_1;
          uStack_120 = 0;
          local_138._0_4_ = (this->m_origin).m_transformMatrix.value[1].field_2;
          local_138._4_4_ = (this->m_origin).m_transformMatrix.value[1].field_3;
          local_148._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_0;
          local_148._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_1;
          fVar2 = *pfVar29;
          fVar3 = pfVar29[1];
          fVar4 = pfVar29[2];
          uStack_b0 = 0;
          uStack_130 = 0;
          uStack_140 = 0;
          local_168._0_4_ = (this->m_origin).m_transformMatrix.value[2].field_2;
          local_168._4_4_ = (this->m_origin).m_transformMatrix.value[2].field_3;
          uStack_160 = 0;
          uVar20 = (this->m_origin).m_transformMatrix.value[3].field_0;
          uVar24 = (this->m_origin).m_transformMatrix.value[3].field_1;
          fVar5 = pfVar29[3];
          uVar21 = (this->m_origin).m_transformMatrix.value[3].field_2;
          uVar25 = (this->m_origin).m_transformMatrix.value[3].field_3;
          local_1a8.value[0].field_2.z =
               (float)uVar21 * fVar5 +
               (float)(undefined4)local_168 * fVar4 +
               (float)(undefined4)local_138 * fVar3 + (float)(undefined4)local_b8 * fVar2;
          local_1a8.value[0].field_3.w =
               fVar5 * (float)uVar25 +
               fVar4 * (float)local_168._4_4_ +
               fVar3 * (float)local_138._4_4_ + fVar2 * (float)local_b8._4_4_;
          fVar6 = pfVar29[4];
          fVar7 = pfVar29[5];
          fVar8 = pfVar29[6];
          fVar9 = pfVar29[7];
          fVar10 = pfVar29[8];
          fVar11 = pfVar29[9];
          fVar12 = pfVar29[10];
          fVar13 = pfVar29[0xb];
          fVar14 = pfVar29[0xc];
          fVar15 = pfVar29[0xd];
          fVar16 = pfVar29[0xe];
          fVar17 = pfVar29[0xf];
          local_1a8.value[0].field_1.y =
               (float)uVar24 * fVar5 +
               (float)local_148._4_4_ * fVar4 +
               (float)local_128._4_4_ * fVar3 + (float)local_d8._4_4_ * fVar2;
          local_1a8.value[0].field_0.x =
               (float)uVar20 * fVar5 +
               (float)(undefined4)local_148 * fVar4 +
               (float)(undefined4)local_128 * fVar3 + (float)local_d8._0_4_ * fVar2;
          local_1a8.value[1].field_0.x =
               (float)uVar20 * fVar9 +
               (float)(undefined4)local_148 * fVar8 +
               (float)(undefined4)local_128 * fVar7 + (float)local_d8._0_4_ * fVar6;
          local_1a8.value[1].field_1.y =
               (float)uVar24 * fVar9 +
               (float)local_148._4_4_ * fVar8 +
               (float)local_128._4_4_ * fVar7 + (float)local_d8._4_4_ * fVar6;
          local_1a8.value[1].field_2.z =
               (float)uVar21 * fVar9 +
               (float)(undefined4)local_168 * fVar8 +
               (float)(undefined4)local_138 * fVar7 + (float)(undefined4)local_b8 * fVar6;
          local_1a8.value[1].field_3.w =
               fVar9 * (float)uVar25 +
               fVar8 * (float)local_168._4_4_ +
               fVar7 * (float)local_138._4_4_ + fVar6 * (float)local_b8._4_4_;
          local_1a8.value[2].field_0.x =
               (float)uVar20 * fVar13 +
               (float)(undefined4)local_148 * fVar12 +
               (float)(undefined4)local_128 * fVar11 + (float)local_d8._0_4_ * fVar10;
          local_1a8.value[2].field_1.y =
               (float)uVar24 * fVar13 +
               (float)local_148._4_4_ * fVar12 +
               (float)local_128._4_4_ * fVar11 + (float)local_d8._4_4_ * fVar10;
          local_1a8.value[2].field_2.z =
               (float)uVar21 * fVar13 +
               (float)(undefined4)local_168 * fVar12 +
               (float)(undefined4)local_138 * fVar11 + (float)(undefined4)local_b8 * fVar10;
          local_1a8.value[2].field_3.w =
               fVar13 * (float)uVar25 +
               fVar12 * (float)local_168._4_4_ +
               fVar11 * (float)local_138._4_4_ + fVar10 * (float)local_b8._4_4_;
          local_1a8.value[3].field_0.x =
               (float)uVar20 * fVar17 +
               (float)(undefined4)local_148 * fVar16 +
               (float)(undefined4)local_128 * fVar15 + (float)local_d8._0_4_ * fVar14;
          local_1a8.value[3].field_1.y =
               (float)uVar24 * fVar17 +
               (float)local_148._4_4_ * fVar16 +
               (float)local_128._4_4_ * fVar15 + (float)local_d8._4_4_ * fVar14;
          local_1a8.value[3].field_2.z =
               (float)uVar21 * fVar17 +
               (float)(undefined4)local_168 * fVar16 +
               (float)(undefined4)local_138 * fVar15 + (float)(undefined4)local_b8 * fVar14;
          local_1a8.value[3].field_3.w =
               (float)uVar25 * fVar17 +
               (float)local_168._4_4_ * fVar16 +
               (float)local_138._4_4_ * fVar15 + (float)local_b8._4_4_ * fVar14;
          local_158 = (float)local_168._4_4_;
          fStack_154 = (float)local_168._4_4_;
          fStack_150 = (float)local_168._4_4_;
          fStack_14c = (float)local_168._4_4_;
          local_118 = (float)local_128._4_4_;
          fStack_114 = (float)local_128._4_4_;
          fStack_110 = (float)local_128._4_4_;
          fStack_10c = (float)local_128._4_4_;
          local_108 = (float)local_b8._4_4_;
          fStack_104 = (float)local_b8._4_4_;
          fStack_100 = (float)local_b8._4_4_;
          fStack_fc = (float)local_b8._4_4_;
          local_f8 = (float)local_148._4_4_;
          fStack_f4 = (float)local_148._4_4_;
          fStack_f0 = (float)local_148._4_4_;
          fStack_ec = (float)local_148._4_4_;
          local_e8 = (float)local_138._4_4_;
          fStack_e4 = (float)local_138._4_4_;
          fStack_e0 = (float)local_138._4_4_;
          fStack_dc = (float)local_138._4_4_;
          local_c8 = (float)local_d8._4_4_;
          fStack_c4 = (float)local_d8._4_4_;
          fStack_c0 = (float)local_d8._4_4_;
          fStack_bc = (float)local_d8._4_4_;
          vera::Shader::setUniform(pSVar26,&local_a0,&local_1a8,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          vera::Model::render(*(Model **)(p_Var30 + 2),pSVar26);
          if ((_uniforms->tracker).m_running == true) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1a8,"render:sceneNormal:",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (*(long *)(p_Var30 + 2) + 0x2b0));
            Tracker::end(local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_1a8);
            if ((col_type *)local_1a8.value[0]._0_8_ != local_1a8.value + 1) {
              operator_delete((void *)local_1a8.value[0]._0_8_,
                              CONCAT44(local_1a8.value[1].field_1,local_1a8.value[1].field_0) + 1);
            }
          }
        }
        p_Var30 = (_Base_ptr)std::_Rb_tree_increment(p_Var30);
      } while ((_Rb_tree_header *)p_Var30 != p_Var1);
    }
    if (this->m_depth_test != false) {
      glDisable(0xb71);
    }
    if (this->m_culling != CULL_NONE) {
      glDisable(0xb44);
    }
    vera::Fbo::unbind(local_38);
  }
  return;
}

Assistant:

void SceneRender::renderNormalBuffer(Uniforms& _uniforms) {
    if (!normalFbo.isAllocated())
        return;

    normalFbo.bind();

    // Begining of DEPTH for 3D 
    if (m_depth_test)
        glEnable(GL_DEPTH_TEST);

    if (_uniforms.activeCamera->bChange || m_origin.bChange) {
        vera::setCamera( _uniforms.activeCamera );
        vera::applyMatrix( m_origin.getTransformMatrix() );
    }

    vera::Shader* normalShader = nullptr;
    if (m_floor_subd_target >= 0) {
        normalShader = m_floor.getBufferShader("normal");
        if (normalShader != nullptr) {
            TRACK_BEGIN("render:sceneNormal:floor")
            normalShader->use();
            _uniforms.feedTo( normalShader, false );
            normalShader->setUniform("u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() * m_floor.getTransformMatrix());
            normalShader->setUniform("u_model", m_origin.getPosition() + m_floor.getPosition() );
            normalShader->setUniform("u_modelMatrix", m_origin.getTransformMatrix() * m_floor.getTransformMatrix() );
            m_floor.render(normalShader);
            TRACK_END("render:sceneNormal:floor")
        } 
    }

    vera::cullingMode(m_culling);

    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
        normalShader = it->second->getBufferShader("normal");
        if (normalShader != nullptr) {
            TRACK_BEGIN("render:sceneNormal:" + it->second->getName() )

            // bind the shader
            normalShader->use();

            // Update Uniforms and textures variables to the shader
            _uniforms.feedTo( normalShader, false );

            // Pass special uniforms
            normalShader->setUniform( "u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() * it->second->getTransformMatrix());
            normalShader->setUniform( "u_model", m_origin.getPosition() + it->second->getPosition() );
            normalShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * it->second->getTransformMatrix() );
            it->second->render(normalShader);

            TRACK_END("render:sceneNormal:" + it->second->getName() )
        }
    }

    if (m_depth_test)
        glDisable(GL_DEPTH_TEST);

    if (m_culling != 0)
        glDisable(GL_CULL_FACE);

    normalFbo.unbind();
}